

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreInstPrinter.c
# Opt level: O3

void XCore_insn_extract(MCInst *MI,char *code)

{
  anon_union_1480_8_3a70395c_for_cs_detail_6 *paVar1;
  uint8_t *puVar2;
  char cVar3;
  cs_opt_value cVar4;
  cs_detail *pcVar5;
  xcore_reg xVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char tmp [128];
  char acStack_98 [128];
  
  strcpy(acStack_98,code);
  pcVar8 = strchr(acStack_98,0x20);
  if (pcVar8 == (char *)0x0) {
    return;
  }
  pcVar8 = pcVar8 + 1;
  pcVar9 = strchr(pcVar8,0x2c);
  if (pcVar9 != (char *)0x0) {
    *pcVar9 = '\0';
    xVar6 = XCore_reg_id(pcVar8);
    if ((xVar6 != XCORE_REG_INVALID) && (MI->csh->detail != CS_OPT_OFF)) {
      pcVar5 = MI->flat_insn->detail;
      puVar2 = pcVar5->groups + (ulong)(pcVar5->field_6).x86.prefix[0] * 0x10 + 0x12;
      puVar2[0] = '\x01';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      pcVar5 = MI->flat_insn->detail;
      *(xcore_reg *)(pcVar5->groups + (ulong)(pcVar5->field_6).x86.prefix[0] * 0x10 + 0x16) = xVar6;
      paVar1 = &MI->flat_insn->detail->field_6;
      (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
    }
    pcVar9 = pcVar9 + 1;
    do {
      pcVar8 = pcVar9;
      cVar3 = *pcVar8;
      pcVar9 = pcVar8 + 1;
    } while (cVar3 == ' ');
    if (cVar3 == '\0') {
      return;
    }
    while (cVar3 != '\0') {
      if (cVar3 == '[') {
        pcVar9[-1] = '\0';
        xVar6 = XCore_reg_id(pcVar8);
        if (xVar6 == XCORE_REG_INVALID) {
          return;
        }
        pcVar8 = pcVar9;
        if (MI->csh->detail != CS_OPT_OFF) {
          pcVar5 = MI->flat_insn->detail;
          puVar2 = pcVar5->groups + (ulong)(pcVar5->field_6).x86.prefix[0] * 0x10 + 0x12;
          puVar2[0] = '\x03';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
          pcVar5 = MI->flat_insn->detail;
          pcVar5->groups[(ulong)(pcVar5->field_6).x86.prefix[0] * 0x10 + 0x16] = (uint8_t)xVar6;
          pcVar5 = MI->flat_insn->detail;
          pcVar5->groups[(ulong)(pcVar5->field_6).x86.prefix[0] * 0x10 + 0x17] = '\0';
          pcVar5 = MI->flat_insn->detail;
          puVar2 = pcVar5->groups + (ulong)(pcVar5->field_6).x86.prefix[0] * 0x10 + 0x1a;
          puVar2[0] = '\0';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
          pcVar5 = MI->flat_insn->detail;
          puVar2 = pcVar5->groups + (ulong)(pcVar5->field_6).x86.prefix[0] * 0x10 + 0x1e;
          puVar2[0] = '\x01';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
        }
        goto LAB_001c0c21;
      }
      cVar3 = *pcVar9;
      pcVar9 = pcVar9 + 1;
    }
  }
  xVar6 = XCore_reg_id(pcVar8);
  if (xVar6 == XCORE_REG_INVALID) {
    return;
  }
  if (MI->csh->detail == CS_OPT_OFF) {
    return;
  }
  pcVar5 = MI->flat_insn->detail;
  puVar2 = pcVar5->groups + (ulong)(pcVar5->field_6).x86.prefix[0] * 0x10 + 0x12;
  puVar2[0] = '\x01';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  pcVar5 = MI->flat_insn->detail;
  *(xcore_reg *)(pcVar5->groups + (ulong)(pcVar5->field_6).x86.prefix[0] * 0x10 + 0x16) = xVar6;
code_r0x001c0c9c:
  paVar1 = &MI->flat_insn->detail->field_6;
  (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
  return;
LAB_001c0c21:
  if (*pcVar8 == '\0') goto LAB_001c0c8f;
  if (*pcVar8 == ']') {
    *pcVar8 = '\0';
    xVar6 = XCore_reg_id(pcVar9);
    cVar4 = MI->csh->detail;
    if (xVar6 == XCORE_REG_INVALID) {
      if (cVar4 != CS_OPT_OFF) {
        iVar7 = atoi(pcVar9);
        pcVar5 = MI->flat_insn->detail;
        *(int *)(pcVar5->groups + (ulong)(pcVar5->field_6).x86.prefix[0] * 0x10 + 0x1a) = iVar7;
      }
    }
    else if (cVar4 != CS_OPT_OFF) {
      pcVar5 = MI->flat_insn->detail;
      pcVar5->groups[(ulong)(pcVar5->field_6).x86.prefix[0] * 0x10 + 0x17] = (uint8_t)xVar6;
    }
    goto LAB_001c0c8f;
  }
  pcVar8 = pcVar8 + 1;
  goto LAB_001c0c21;
LAB_001c0c8f:
  if (MI->csh->detail == CS_OPT_OFF) {
    return;
  }
  goto code_r0x001c0c9c;
}

Assistant:

void XCore_insn_extract(MCInst *MI, const char *code)
{
	int id;
	char *p, *p2;
	char tmp[128];

// make MSVC shut up on strcpy()
#ifdef _MSC_VER
#pragma warning(push)
#pragma warning(disable : 4996)
#endif
	strcpy(tmp, code); // safe because code is way shorter than 128 bytes
#ifdef _MSC_VER
#pragma warning(pop)
#endif

	// find the first space
	p = strchr(tmp, ' ');
	if (p) {
		p++;
		// find the next ','
		p2 = strchr(p, ',');
		if (p2) {
			*p2 = '\0';
			id = XCore_reg_id(p);
			if (id) {
				// register
				if (MI->csh->detail) {
					MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_REG;
					MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].reg = id;
					MI->flat_insn->detail->xcore.op_count++;
				}
			}
			// next should be register, or memory?
			// skip space
			p2++;
			while(*p2 && *p2 == ' ')
				p2++;
			if (*p2) {
				// find '['
				p = p2;
				while(*p && *p != '[')
					p++;
				if (*p) {
					// this is '['
					*p = '\0';
					id = XCore_reg_id(p2);
					if (id) {
						// base register
						if (MI->csh->detail) {
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_MEM;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.base = (uint8_t)id;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.index = XCORE_REG_INVALID;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.disp = 0;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.direct = 1;
						}

						p++;
						p2 = p;
						// until ']'
						while(*p && *p != ']')
							p++;
						if (*p) {
							*p = '\0';
							// p2 is either index, or disp
							id = XCore_reg_id(p2);
							if (id) {
								// index register
								if (MI->csh->detail) {
									MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.index = (uint8_t)id;
								}
							} else {
								// a number means disp
								if (MI->csh->detail) {
									MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.disp = atoi(p2);
								}
							}
						}

						if (MI->csh->detail) {
							MI->flat_insn->detail->xcore.op_count++;
						}
					}
				} else {
					// a register?
					id = XCore_reg_id(p2);
					if (id) {
						// register
						if (MI->csh->detail) {
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_REG;
							MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].reg = id;
							MI->flat_insn->detail->xcore.op_count++;
						}
					}
				}
			}
		} else {
			id = XCore_reg_id(p);
			if (id) {
				// register
				if (MI->csh->detail) {
					MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_REG;
					MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].reg = id;
					MI->flat_insn->detail->xcore.op_count++;
				}
			}
		}
	}
}